

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_stream.hpp
# Opt level: O2

basic_binary_ostream<fail_flag_serialization_policy> *
detail::operator<<(ostream_mixin<basic_binary_ostream<fail_flag_serialization_policy>,_span<std::byte>,_fail_flag_serialization_policy>
                   *stream,person *value)

{
  size_type sVar1;
  size_t sVar2;
  
  if ((stream->
      super_stream_mixin_base<basic_binary_ostream<fail_flag_serialization_policy>,_span<std::byte>,_fail_flag_serialization_policy>
      ).super_fail_flag_serialization_policy.overflow != true) {
    sVar1 = (value->name)._M_string_length;
    sVar2 = span<std::byte>::size((span<std::byte> *)(stream + -0x10));
    if (sVar2 < sVar1 + 0xc) {
      (stream->
      super_stream_mixin_base<basic_binary_ostream<fail_flag_serialization_policy>,_span<std::byte>,_fail_flag_serialization_policy>
      ).super_fail_flag_serialization_policy.overflow = true;
    }
    else {
      do_serialize<person>(value,(span<std::byte> *)(stream + -0x10));
    }
  }
  return (basic_binary_ostream<fail_flag_serialization_policy> *)(stream + -0x10);
}

Assistant:

StreamDerived& operator<<(ostream_mixin<StreamDerived, SpanBase, fail_flag_serialization_policy>& stream, T const& value) {
        if (stream.overflow) return stream.base();

        auto const size = get_serialized_size(value);
        if (size > stream.span().size()) {
            stream.overflow = true;
            return stream.base();
        }
        serialize(value, stream.span());
        return stream.base();
    }